

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

uint8_t * Fossilize::decode_base64(ScratchAllocator *allocator,char *data,size_t length)

{
  char cVar1;
  char cVar2;
  char cVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  byte *pbVar7;
  long lVar8;
  byte *pbVar9;
  ulong uVar10;
  byte *pbVar11;
  byte bVar12;
  size_t sVar13;
  
  sVar13 = length;
  pbVar7 = (byte *)ScratchAllocator::allocate_raw(allocator,length,0x10);
  uVar10 = 0;
  pbVar11 = pbVar7;
  do {
    if ((((length <= uVar10) || (*data == '\0')) || (cVar1 = data[1], cVar1 == '\0')) ||
       ((cVar2 = data[2], cVar2 == '\0' || (cVar3 = data[3], cVar3 == '\0')))) {
      return pbVar7;
    }
    uVar4 = decode_base64::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(ulong)(uint)(int)*data,(char)sVar13);
    uVar5 = decode_base64::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)(ulong)(uint)(int)cVar1,(char)sVar13);
    bVar12 = (byte)((uVar4 << 0x12) >> 0x10) | (byte)((uVar5 << 0xc) >> 0x10);
    if (cVar3 == '=' && cVar2 == '=') {
      lVar8 = 1;
      pbVar9 = pbVar11;
LAB_00117d3a:
      *pbVar9 = bVar12;
      pbVar9 = pbVar11 + lVar8;
    }
    else {
      uVar4 = decode_base64::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(ulong)(uint)(int)cVar2,(char)sVar13);
      uVar6 = decode_base64::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)(ulong)(uint)(int)cVar3,(char)sVar13);
      pbVar9 = pbVar11 + 2;
      *pbVar11 = bVar12;
      pbVar11[1] = (byte)((uVar5 << 0xc) >> 8) | (byte)((uVar4 << 6) >> 8);
      if (cVar3 != '=') {
        bVar12 = (byte)(uVar4 << 6) | (byte)uVar6;
        lVar8 = 3;
        goto LAB_00117d3a;
      }
      lVar8 = 2;
    }
    uVar10 = uVar10 + lVar8;
    data = data + 4;
    pbVar11 = pbVar9;
  } while( true );
}

Assistant:

static uint8_t *decode_base64(ScratchAllocator &allocator, const char *data, size_t length)
{
	auto *buf = static_cast<uint8_t *>(allocator.allocate_raw(length, 16));
	auto *ptr = buf;

	const auto base64_index = [](char c) -> uint32_t {
		if (c >= 'A' && c <= 'Z')
			return uint32_t(c - 'A');
		else if (c >= 'a' && c <= 'z')
			return uint32_t(c - 'a') + 26;
		else if (c >= '0' && c <= '9')
			return uint32_t(c - '0') + 52;
		else if (c == '+')
			return 62;
		else if (c == '/')
			return 63;
		else
			return 0;
	};

	for (uint64_t i = 0; i < length; )
	{
		char c0 = *data++;
		if (c0 == '\0')
			break;
		char c1 = *data++;
		if (c1 == '\0')
			break;
		char c2 = *data++;
		if (c2 == '\0')
			break;
		char c3 = *data++;
		if (c3 == '\0')
			break;

		uint32_t values =
				(base64_index(c0) << 18) |
				(base64_index(c1) << 12) |
				(base64_index(c2) << 6) |
				(base64_index(c3) << 0);

		unsigned outbytes = 3;
		if (c2 == '=' && c3 == '=')
		{
			outbytes = 1;
			*ptr++ = uint8_t(values >> 16);
		}
		else if (c3 == '=')
		{
			outbytes = 2;
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
		}
		else
		{
			*ptr++ = uint8_t(values >> 16);
			*ptr++ = uint8_t(values >> 8);
			*ptr++ = uint8_t(values >> 0);
		}

		i += outbytes;
	}

	return buf;
}